

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O0

bool renderKeyPresses(stStateUI *stateUI,TWaveform *waveform,TKeyPressCollection *keyPresses)

{
  int iVar1;
  const_iterator __position;
  ImVec2 graph_size;
  ImVec2 graph_size_00;
  ImVec2 graph_size_01;
  ImVec2 graph_size_02;
  ImVec2 graph_size_03;
  bool bVar2;
  size_type sVar3;
  int *piVar4;
  ImGuiIO *pIVar5;
  size_type sVar6;
  long *plVar7;
  reference pvVar8;
  float *pfVar9;
  ImDrawList *pIVar10;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *in_RDX;
  vector<short,_std::allocator<short>_> *in_RSI;
  long in_RDI;
  float fVar11;
  float fVar12;
  float fVar13;
  ImVec2 p1_5;
  ImVec2 p0_5;
  ImVec2 savePos_2;
  ImVec2 p;
  ImVec2 savePos_1;
  ImVec2 p1_4;
  ImVec2 p0_4;
  float x0_3;
  int i_2;
  ImVec2 p1_3;
  ImVec2 p0_3;
  float x0_2;
  float col;
  bool isHovered;
  float xmax;
  float xmin;
  ImVec2 p2;
  ImVec2 p1_2;
  ImVec2 p0_2;
  float x2;
  float x1;
  float x0_1;
  ImVec2 p1_1;
  ImVec2 p0_1;
  float x0;
  int i_1;
  ImVec2 savePos2;
  TKeyPressData entry_1;
  TKeyPressData entry;
  int64_t pmax;
  int64_t pmin;
  int64_t p1;
  int64_t p0;
  int64_t pos;
  int i;
  int nview_old;
  float w;
  stWaveformView<short> mview;
  stWaveformView<short> tview;
  ImDrawList *drawList;
  ImVec2 savePos;
  ImVec2 mpos;
  stWaveformView<short> wview;
  ImVec2 wsize;
  bool ignoreDelete;
  TWaveform *waveformMax;
  TWaveform *waveformThreshold;
  TWaveform *waveformLowRes;
  int *nviewPrev;
  float *scrollSize;
  float *dragOffset;
  float *amax;
  float *amin;
  int *lastKeyPresses;
  int *lastSize;
  int *offset;
  int *viewMax;
  int *viewMin;
  int *nview;
  bool *recalculateKeyPresses;
  bool *scrolling;
  TParameters *params;
  undefined4 in_stack_fffffffffffff8b8;
  ImGuiMouseButton in_stack_fffffffffffff8bc;
  stKeyPressData<short> *in_stack_fffffffffffff8c0;
  value_type *in_stack_fffffffffffff8c8;
  ImU32 in_stack_fffffffffffff8d0;
  float in_stack_fffffffffffff8d4;
  uint uVar14;
  float in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8dc;
  ImDrawList *in_stack_fffffffffffff8e0;
  char *in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8f0;
  undefined1 in_stack_fffffffffffff8f4;
  undefined1 in_stack_fffffffffffff8f5;
  undefined1 in_stack_fffffffffffff8f6;
  undefined1 in_stack_fffffffffffff8f7;
  byte bVar15;
  ImVec2 *in_stack_fffffffffffff900;
  float in_stack_fffffffffffff908;
  ImU32 in_stack_fffffffffffff90c;
  ImU32 col_00;
  ImDrawList *in_stack_fffffffffffff910;
  float in_stack_fffffffffffff918;
  float in_stack_fffffffffffff91c;
  float in_stack_fffffffffffff920;
  float in_stack_fffffffffffff924;
  float in_stack_fffffffffffff928;
  float in_stack_fffffffffffff92c;
  undefined1 in_stack_fffffffffffff938 [16];
  float in_stack_fffffffffffff948;
  ImU32 in_stack_fffffffffffff94c;
  ImVec2 *in_stack_fffffffffffff950;
  ImVec2 *in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  value_type *in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff974;
  const_iterator in_stack_fffffffffffff978;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *in_stack_fffffffffffff9e0;
  int in_stack_fffffffffffff9e8;
  float in_stack_fffffffffffff9ec;
  undefined1 local_510 [20];
  float fStack_4fc;
  ImVec2 local_4f8;
  ImVec2 local_4f0;
  ImVec2 local_4e4;
  ImVec2 local_4dc;
  ImVec2 local_4d4;
  int local_4cc;
  stWaveformView<short> local_4c8;
  ImVec2 local_4b8;
  undefined1 in_stack_fffffffffffffb57;
  float in_stack_fffffffffffffb58;
  float in_stack_fffffffffffffb5c;
  double in_stack_fffffffffffffb60;
  ImVec2 in_stack_fffffffffffffb68;
  TWaveformT<short> *in_stack_fffffffffffffb70;
  ImVec2 IVar16;
  ImVec2 in_stack_fffffffffffffb78;
  ImVec2 in_stack_fffffffffffffb80;
  ImVec4 local_478;
  ImVec2 local_468;
  ImVec2 local_460;
  float local_458;
  ImU32 local_454;
  ImVec4 local_450;
  ImVec2 local_440;
  ImVec2 local_438;
  float local_430;
  string local_420 [32];
  ImVec2 local_400;
  ImVec2 local_3f8;
  stKeyPressData<short> *local_3f0;
  stKeyPressData<short> *local_3e8;
  stKeyPressData<short> *local_3e0;
  float in_stack_fffffffffffffc34;
  bool *in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  ImVec2 local_3b0;
  ImVec2 local_3a8;
  ImVec2 local_3a0;
  float local_398;
  float local_394;
  float local_390;
  ImVec4 local_38c;
  ImVec2 local_37c;
  ImVec2 local_374;
  float local_36c;
  uint local_368;
  int local_364;
  int local_360 [2];
  ImVec2 local_358;
  ImVec4 local_350;
  ImVec2 local_340;
  ImVec2 local_338;
  ImVec4 local_330;
  ImVec2 local_320;
  ImVec2 local_318;
  ImVec2 local_310;
  stWaveformView<short> local_308;
  short *local_2f8;
  int64_t local_2f0;
  long local_2e8;
  stKeyPressData<short> *local_2c8;
  stKeyPressData<short> *local_2c0;
  stKeyPressData<short> *local_2b8;
  stWaveformView<short> local_2a8;
  short *local_298;
  int64_t local_290;
  long local_288;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  int local_23c;
  ImVec2 local_238;
  float local_230;
  float local_22c;
  int local_228;
  float local_224;
  ImVec4 local_218;
  ImVec4 local_208;
  ImVec4 local_1f0;
  ImVec4 local_1e0;
  ImVec4 local_1c8;
  ImVec4 local_1b8;
  ImVec4 local_1a0;
  ImVec4 local_190;
  stWaveformView<short> local_180;
  stWaveformView<short> local_170;
  ImVec4 local_158;
  ImVec4 local_148;
  ImVec4 local_130;
  ImVec4 local_120;
  ImDrawList *local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  stWaveformView<short> local_f8;
  float local_e4;
  float local_e0;
  ImVec2 local_dc;
  ImVec2 local_d4;
  byte local_c9;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  int local_a8 [2];
  vector<short,_std::allocator<short>_> *local_a0;
  vector<short,_std::allocator<short>_> *local_98;
  long local_90;
  int *local_88;
  float *local_80;
  float *local_78;
  long local_70;
  long local_68;
  long local_60;
  int *local_58;
  int *local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  byte *local_30;
  byte *local_28;
  long local_20;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *local_18;
  vector<short,_std::allocator<short>_> *local_10;
  long local_8;
  
  local_20 = in_RDI + 0xf0;
  local_28 = (byte *)(in_RDI + 0xb);
  local_30 = (byte *)(in_RDI + 0xc);
  local_38 = (int *)(in_RDI + 0x10);
  local_40 = (int *)(in_RDI + 0x18);
  local_48 = (int *)(in_RDI + 0x1c);
  local_50 = (int *)(in_RDI + 0x14);
  local_58 = (int *)(in_RDI + 0x24);
  local_60 = in_RDI + 0x28;
  local_68 = in_RDI + 0x2c;
  local_70 = in_RDI + 0x30;
  local_78 = (float *)(in_RDI + 0x34);
  local_80 = (float *)(in_RDI + 0x38);
  local_88 = (int *)(in_RDI + 0x20);
  local_90 = in_RDI + 0x40;
  local_98 = (vector<short,_std::allocator<short>_> *)(in_RDI + 0x58);
  local_a0 = (vector<short,_std::allocator<short>_> *)(in_RDI + 0x70);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*local_38 < 0) {
    sVar3 = std::vector<short,_std::allocator<short>_>::size(in_RSI);
    *local_38 = (int)sVar3;
  }
  if (*local_50 < 0) {
    sVar3 = std::vector<short,_std::allocator<short>_>::size(local_10);
    *local_50 = (int)(sVar3 - (long)*local_38 >> 1);
  }
  if ((((*(byte *)(local_8 + 8) & 1) != 0) && (*local_38 < 0x80000)) && ((*local_28 & 1) == 0)) {
    local_a8[1] = 0x80000;
    sVar3 = std::vector<short,_std::allocator<short>_>::size(local_10);
    local_a8[0] = (int)sVar3;
    piVar4 = std::min<int>(local_a8 + 1,local_a8);
    *local_38 = *piVar4;
  }
  iVar1 = *local_58;
  sVar3 = std::vector<short,_std::allocator<short>_>::size(local_10);
  if (iVar1 != (int)sVar3) {
    sVar3 = std::vector<short,_std::allocator<short>_>::size(local_10);
    *local_48 = (int)sVar3;
    sVar3 = std::vector<short,_std::allocator<short>_>::size(local_10);
    *local_58 = (int)sVar3;
    *local_88 = *local_38 + 1;
    if ((*local_28 & 1) == 0) {
      sVar3 = std::vector<short,_std::allocator<short>_>::size(local_10);
      *local_50 = (int)sVar3 - *local_38;
    }
  }
  ImVec2::ImVec2(&local_b0,0.0,*(float *)(local_8 + 0x88));
  ImVec2::ImVec2(&local_b8,0.0,0.0);
  ImGui::SetNextWindowPos
            ((ImVec2 *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (ImGuiCond)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
             (ImVec2 *)in_stack_fffffffffffff8c0);
  if ((*(float *)(local_8 + 0x8c) != 0.0) || (NAN(*(float *)(local_8 + 0x8c)))) {
    ImVec2::ImVec2(&local_c8,(float)g_windowSizeX,*(float *)(local_8 + 0x8c));
    ImGui::SetNextWindowSize
              ((ImVec2 *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
               (ImGuiCond)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
  }
  else {
    ImVec2::ImVec2(&local_c0,(float)g_windowSizeX,250.0);
    ImGui::SetNextWindowSize
              ((ImVec2 *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
               (ImGuiCond)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
  }
  bVar2 = ImGui::Begin((char *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                       in_stack_fffffffffffffc38,(ImGuiWindowFlags)in_stack_fffffffffffffc34);
  if (bVar2) {
    local_c9 = 0;
    fVar11 = ImGui::GetContentRegionAvailWidth();
    local_dc = ImGui::GetContentRegionAvail();
    fVar13 = local_dc.y;
    fVar12 = ImGui::GetTextLineHeightWithSpacing();
    ImVec2::ImVec2(&local_d4,fVar11,fVar12 * -3.0 + fVar13);
    if (*local_38 != *local_88) {
      local_e0 = 1.0;
      local_e4 = (float)*local_38 / local_d4.x;
      std::max<float>(&local_e0,&local_e4);
      generateLowResWaveform<short>
                ((TWaveformT<short> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                 (TWaveformT<short> *)in_stack_fffffffffffff8c8,
                 (int)((ulong)in_stack_fffffffffffff8c0 >> 0x20));
      *local_88 = *local_38;
    }
    local_f8 = getView<short>((TWaveformT<short> *)in_stack_fffffffffffff8c0,
                              CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),0x18b977
                             );
    pIVar5 = ImGui::GetIO();
    local_100 = pIVar5->MousePos;
    local_108 = ImGui::GetCursorScreenPos();
    local_110 = ImGui::GetWindowDrawList();
    ImVec4::ImVec4(&local_120,0.3,0.3,0.3,0.3);
    ImGui::PushStyleColor
              ((ImGuiCol)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
               (ImVec4 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    ImVec4::ImVec4(&local_130,1.0,1.0,1.0,1.0);
    ImGui::PushStyleColor
              ((ImGuiCol)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
               (ImVec4 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    IVar16.y._0_1_ = in_stack_fffffffffffff8f4;
    IVar16.x = (float)in_stack_fffffffffffff8f0;
    IVar16.y._1_1_ = in_stack_fffffffffffff8f5;
    IVar16.y._2_1_ = in_stack_fffffffffffff8f6;
    IVar16.y._3_1_ = in_stack_fffffffffffff8f7;
    ImGui::PlotHistogram
              (in_stack_fffffffffffff8e8,(_func_float_void_ptr_int *)in_stack_fffffffffffff8e0,
               (void *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
               (int)in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0,
               (char *)in_stack_fffffffffffff8c8,(float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
               SUB84(in_stack_fffffffffffff8c0,0),IVar16);
    ImGui::PopStyleColor((int)((ulong)in_stack_fffffffffffff8c0 >> 0x20));
    ImGui::SetCursorScreenPos((ImVec2 *)in_stack_fffffffffffff8c0);
    ImVec4::ImVec4(&local_148,0.1,0.1,0.1,0.0);
    ImGui::PushStyleColor
              ((ImGuiCol)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
               (ImVec4 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    ImVec4::ImVec4(&local_158,1.0,1.0,1.0,1.0);
    ImGui::PushStyleColor
              ((ImGuiCol)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
               (ImVec4 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    graph_size.y._0_1_ = in_stack_fffffffffffff8f4;
    graph_size.x = (float)in_stack_fffffffffffff8f0;
    graph_size.y._1_1_ = in_stack_fffffffffffff8f5;
    graph_size.y._2_1_ = in_stack_fffffffffffff8f6;
    graph_size.y._3_1_ = in_stack_fffffffffffff8f7;
    ImGui::PlotHistogram
              (in_stack_fffffffffffff8e8,(_func_float_void_ptr_int *)in_stack_fffffffffffff8e0,
               (void *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
               (int)in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0,
               (char *)in_stack_fffffffffffff8c8,(float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
               SUB84(in_stack_fffffffffffff8c0,0),graph_size);
    ImGui::PopStyleColor((int)((ulong)in_stack_fffffffffffff8c0 >> 0x20));
    sVar3 = std::vector<short,_std::allocator<short>_>::size(local_10);
    sVar6 = std::vector<short,_std::allocator<short>_>::size(local_98);
    if (sVar3 == sVar6) {
      sVar3 = std::vector<short,_std::allocator<short>_>::size(local_10);
      sVar6 = std::vector<short,_std::allocator<short>_>::size(local_a0);
      if (sVar3 == sVar6) {
        local_170 = getView<short>((TWaveformT<short> *)in_stack_fffffffffffff8c0,
                                   CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                                   0x18bc24);
        local_180 = getView<short>((TWaveformT<short> *)in_stack_fffffffffffff8c0,
                                   CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                                   0x18bc57);
        ImGui::SetCursorScreenPos((ImVec2 *)in_stack_fffffffffffff8c0);
        ImVec4::ImVec4(&local_190,0.0,0.0,0.0,0.0);
        ImGui::PushStyleColor
                  ((ImGuiCol)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
                   (ImVec4 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
        ImVec4::ImVec4(&local_1a0,1.0,1.0,0.0,0.5);
        ImGui::PushStyleColor
                  ((ImGuiCol)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
                   (ImVec4 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
        graph_size_00.y._0_1_ = in_stack_fffffffffffff8f4;
        graph_size_00.x = (float)in_stack_fffffffffffff8f0;
        graph_size_00.y._1_1_ = in_stack_fffffffffffff8f5;
        graph_size_00.y._2_1_ = in_stack_fffffffffffff8f6;
        graph_size_00.y._3_1_ = in_stack_fffffffffffff8f7;
        ImGui::PlotLines(in_stack_fffffffffffff8e8,
                         (_func_float_void_ptr_int *)in_stack_fffffffffffff8e0,
                         (void *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                         (int)in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0,
                         (char *)in_stack_fffffffffffff8c8,
                         (float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                         SUB84(in_stack_fffffffffffff8c0,0),graph_size_00);
        ImGui::PopStyleColor((int)((ulong)in_stack_fffffffffffff8c0 >> 0x20));
        ImGui::SetCursorScreenPos((ImVec2 *)in_stack_fffffffffffff8c0);
        ImVec4::ImVec4(&local_1b8,0.0,0.0,0.0,0.0);
        ImGui::PushStyleColor
                  ((ImGuiCol)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
                   (ImVec4 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
        ImVec4::ImVec4(&local_1c8,1.0,1.0,0.0,0.5);
        ImGui::PushStyleColor
                  ((ImGuiCol)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
                   (ImVec4 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
        graph_size_01.y._0_1_ = in_stack_fffffffffffff8f4;
        graph_size_01.x = (float)in_stack_fffffffffffff8f0;
        graph_size_01.y._1_1_ = in_stack_fffffffffffff8f5;
        graph_size_01.y._2_1_ = in_stack_fffffffffffff8f6;
        graph_size_01.y._3_1_ = in_stack_fffffffffffff8f7;
        ImGui::PlotLines(in_stack_fffffffffffff8e8,
                         (_func_float_void_ptr_int *)in_stack_fffffffffffff8e0,
                         (void *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                         (int)in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0,
                         (char *)in_stack_fffffffffffff8c8,
                         (float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                         SUB84(in_stack_fffffffffffff8c0,0),graph_size_01);
        ImGui::PopStyleColor((int)((ulong)in_stack_fffffffffffff8c0 >> 0x20));
        ImGui::SetCursorScreenPos((ImVec2 *)in_stack_fffffffffffff8c0);
        ImVec4::ImVec4(&local_1e0,0.0,0.0,0.0,0.0);
        ImGui::PushStyleColor
                  ((ImGuiCol)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
                   (ImVec4 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
        ImVec4::ImVec4(&local_1f0,0.0,1.0,0.0,0.5);
        ImGui::PushStyleColor
                  ((ImGuiCol)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
                   (ImVec4 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
        graph_size_02.y._0_1_ = in_stack_fffffffffffff8f4;
        graph_size_02.x = (float)in_stack_fffffffffffff8f0;
        graph_size_02.y._1_1_ = in_stack_fffffffffffff8f5;
        graph_size_02.y._2_1_ = in_stack_fffffffffffff8f6;
        graph_size_02.y._3_1_ = in_stack_fffffffffffff8f7;
        ImGui::PlotLines(in_stack_fffffffffffff8e8,
                         (_func_float_void_ptr_int *)in_stack_fffffffffffff8e0,
                         (void *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                         (int)in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0,
                         (char *)in_stack_fffffffffffff8c8,
                         (float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                         SUB84(in_stack_fffffffffffff8c0,0),graph_size_02);
        ImGui::PopStyleColor((int)((ulong)in_stack_fffffffffffff8c0 >> 0x20));
        ImGui::SetCursorScreenPos((ImVec2 *)in_stack_fffffffffffff8c0);
        ImVec4::ImVec4(&local_208,0.0,0.0,0.0,0.0);
        ImGui::PushStyleColor
                  ((ImGuiCol)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
                   (ImVec4 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
        ImVec4::ImVec4(&local_218,0.0,1.0,0.0,0.5);
        ImGui::PushStyleColor
                  ((ImGuiCol)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
                   (ImVec4 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
        graph_size_03.y._0_1_ = in_stack_fffffffffffff8f4;
        graph_size_03.x = (float)in_stack_fffffffffffff8f0;
        graph_size_03.y._1_1_ = in_stack_fffffffffffff8f5;
        graph_size_03.y._2_1_ = in_stack_fffffffffffff8f6;
        graph_size_03.y._3_1_ = in_stack_fffffffffffff8f7;
        ImGui::PlotLines(in_stack_fffffffffffff8e8,
                         (_func_float_void_ptr_int *)in_stack_fffffffffffff8e0,
                         (void *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                         (int)in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0,
                         (char *)in_stack_fffffffffffff8c8,
                         (float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                         SUB84(in_stack_fffffffffffff8c0,0),graph_size_03);
        ImGui::PopStyleColor((int)((ulong)in_stack_fffffffffffff8c0 >> 0x20));
      }
    }
    ImGui::SetCursorScreenPos((ImVec2 *)in_stack_fffffffffffff8c0);
    ImGui::InvisibleButton
              ((char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
               in_stack_fffffffffffff900);
    bVar2 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffff8c0);
    if (bVar2) {
      pIVar5 = ImGui::GetIO();
      local_224 = pIVar5->MouseWheel;
      local_228 = *local_38;
      *local_38 = (int)((float)*local_38 * ((local_224 + 10.0) / 10.0));
      piVar4 = std::max<int>(local_40,local_38);
      piVar4 = std::min<int>(piVar4,local_48);
      *local_38 = *piVar4;
      if ((local_224 != 0.0) || (NAN(local_224))) {
        local_22c = 0.0;
        local_230 = ((local_100.x - local_108.x) / local_d4.x) * (float)(local_228 - *local_38) +
                    (float)*local_50;
        pfVar9 = std::max<float>(&local_22c,&local_230);
        *local_50 = (int)*pfVar9;
      }
      bVar2 = ImGui::IsMouseDown((ImGuiMouseButton)((ulong)in_stack_fffffffffffff8c0 >> 0x20));
      if ((bVar2) &&
         (bVar2 = ImGui::IsMouseDragging
                            (in_stack_fffffffffffff8d0,
                             (float)((ulong)in_stack_fffffffffffff8c8 >> 0x20)), !bVar2)) {
        *local_78 = (float)*local_50;
      }
      bVar2 = ImGui::IsMouseDragging
                        (in_stack_fffffffffffff8d0,(float)((ulong)in_stack_fffffffffffff8c8 >> 0x20)
                        );
      if (bVar2) {
        in_stack_fffffffffffff9ec = *local_78;
        local_238 = ImGui::GetMouseDragDelta
                              ((ImGuiMouseButton)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
                               SUB84(in_stack_fffffffffffff8c8,0));
        *local_50 = (int)(in_stack_fffffffffffff9ec - (local_238.x * (float)*local_38) / local_d4.x)
        ;
      }
      bVar2 = ImGui::IsMouseReleased((ImGuiMouseButton)((ulong)in_stack_fffffffffffff8c0 >> 0x20));
      if (((bVar2) && (pIVar5 = ImGui::GetIO(), (pIVar5->KeyCtrl & 1U) != 0)) ||
         (bVar2 = ImGui::IsMouseDoubleClicked
                            ((ImGuiMouseButton)((ulong)in_stack_fffffffffffff8c0 >> 0x20)), bVar2))
      {
        local_248 = (long)((float)*local_50 +
                          ((float)*local_38 * (local_100.x - local_108.x)) / local_d4.x);
        local_23c = 0;
        while (in_stack_fffffffffffff9e8 = local_23c,
              sVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                      size(local_18), in_stack_fffffffffffff9e8 < (int)sVar3) {
          pvVar8 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                   operator[](local_18,(long)local_23c);
          local_250 = (pvVar8->pos + (long)*(int *)(local_20 + 8)) - (long)*(int *)(local_20 + 4);
          pvVar8 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                   operator[](local_18,(long)local_23c);
          local_258 = pvVar8->pos + (long)*(int *)(local_20 + 8) + (long)*(int *)(local_20 + 4);
          pvVar8 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                   operator[](local_18,(long)local_23c);
          plVar7 = std::min<long>(&pvVar8->pos,&local_250);
          plVar7 = std::min<long>(plVar7,&local_258);
          local_260 = *plVar7;
          pvVar8 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                   operator[](local_18,(long)local_23c);
          plVar7 = std::max<long>(&pvVar8->pos,&local_250);
          plVar7 = std::max<long>(plVar7,&local_258);
          local_268 = *plVar7;
          if (local_248 < local_260) {
            local_c9 = 1;
            stKeyPressData<short>::stKeyPressData(in_stack_fffffffffffff8c0);
            local_288 = local_248;
            local_2a8 = getView<short>((TWaveformT<short> *)in_stack_fffffffffffff8c0,
                                       CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8)
                                      );
            local_298 = local_2a8.samples;
            local_290 = local_2a8.n;
            in_stack_fffffffffffff9e0 = local_18;
            local_2c0 = (stKeyPressData<short> *)
                        std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                        ::begin((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
            local_2b8 = (stKeyPressData<short> *)
                        __gnu_cxx::
                        __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                        ::operator+((__normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                                     *)in_stack_fffffffffffff8c8,
                                    (difference_type)in_stack_fffffffffffff8c0);
            __gnu_cxx::
            __normal_iterator<stKeyPressData<short>const*,std::vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>>>
            ::__normal_iterator<stKeyPressData<short>*>
                      ((__normal_iterator<const_stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                        *)in_stack_fffffffffffff8c0,
                       (__normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
            local_2c8 = (stKeyPressData<short> *)
                        std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                        ::insert((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                                 in_stack_fffffffffffff978,in_stack_fffffffffffff968);
            break;
          }
          if ((local_260 <= local_248) && (local_248 <= local_268)) break;
          local_23c = local_23c + 1;
        }
        iVar1 = local_23c;
        sVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size
                          (local_18);
        if ((iVar1 == (int)sVar3) && ((local_c9 & 1) == 0)) {
          local_c9 = 1;
          stKeyPressData<short>::stKeyPressData(in_stack_fffffffffffff8c0);
          local_2e8 = local_248;
          local_308 = getView<short>((TWaveformT<short> *)in_stack_fffffffffffff8c0,
                                     CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
          local_2f8 = local_308.samples;
          local_2f0 = local_308.n;
          std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::push_back
                    ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     in_stack_fffffffffffff8c8);
        }
      }
    }
    bVar2 = ImGui::BeginPopupContextWindow
                      ((char *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc,
                       SUB41((uint)in_stack_fffffffffffff8b8 >> 0x18,0));
    if (bVar2) {
      ImGui::SliderInt((char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                       (int *)in_stack_fffffffffffff8c8,
                       (int)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                       (int)in_stack_fffffffffffff8c0,
                       (char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
      std::vector<short,_std::allocator<short>_>::size(local_10);
      ImGui::DragInt((char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (int *)in_stack_fffffffffffff8c8,
                     (float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                     (int)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc,(char *)0x18c73e);
      ImGui::SliderFloat((char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                         (float *)in_stack_fffffffffffff8c8,
                         (float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                         SUB84(in_stack_fffffffffffff8c0,0),
                         (char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),0.0);
      ImGui::SliderFloat((char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                         (float *)in_stack_fffffffffffff8c8,
                         (float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                         SUB84(in_stack_fffffffffffff8c0,0),
                         (char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),0.0);
      ImGui::EndPopup();
    }
    ImVec2::ImVec2(&local_310,local_d4.x,*local_80);
    ImGui::InvisibleButton
              ((char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
               in_stack_fffffffffffff900);
    ImVec2::ImVec2(&local_318,local_108.x,local_108.y + local_d4.y);
    ImVec2::ImVec2(&local_320,local_108.x + local_d4.x,local_108.y + local_d4.y + *local_80);
    ImVec4::ImVec4(&local_330,1.0,1.0,1.0,1.0);
    ImGui::ColorConvertFloat4ToU32((ImVec4 *)in_stack_fffffffffffff8c0);
    ImDrawList::AddRect((ImDrawList *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                        in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                        in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
                        in_stack_fffffffffffff938._12_4_,in_stack_fffffffffffff938._8_4_);
    ImVec2::ImVec2(&local_338,local_108.x + (local_d4.x * (float)*local_50) / (float)*local_48,
                   local_108.y + local_d4.y);
    ImVec2::ImVec2(&local_340,
                   local_108.x +
                   (local_d4.x * ((float)*local_50 + (float)*local_38)) / (float)*local_48,
                   local_108.y + local_d4.y + *local_80);
    ImVec4::ImVec4(&local_350,1.0,1.0,1.0,1.0);
    ImGui::ColorConvertFloat4ToU32((ImVec4 *)in_stack_fffffffffffff8c0);
    ImDrawList::AddRectFilled
              (in_stack_fffffffffffff8e0,
               (ImVec2 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
               (ImVec2 *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
               (ImU32)((ulong)in_stack_fffffffffffff8c8 >> 0x20),SUB84(in_stack_fffffffffffff8c8,0),
               (ImDrawCornerFlags)((ulong)in_stack_fffffffffffff8c0 >> 0x20));
    local_358 = ImGui::GetCursorScreenPos();
    bVar2 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffff8c0);
    if ((bVar2) &&
       (bVar2 = ImGui::IsMouseDown((ImGuiMouseButton)((ulong)in_stack_fffffffffffff8c0 >> 0x20)),
       bVar2)) {
      *local_28 = 1;
    }
    if ((*local_28 & 1) != 0) {
      *local_50 = (int)(((local_100.x - local_108.x) / local_d4.x) * (float)*local_48 +
                       -(float)(*local_38 / 2));
    }
    bVar2 = ImGui::IsMouseDown((ImGuiMouseButton)((ulong)in_stack_fffffffffffff8c0 >> 0x20));
    if (!bVar2) {
      *local_28 = 0;
    }
    local_360[1] = 0;
    local_360[0] = *local_50;
    sVar3 = std::vector<short,_std::allocator<short>_>::size(local_10);
    local_364 = (int)sVar3 - *local_38;
    piVar4 = std::min<int>(local_360,&local_364);
    piVar4 = std::max<int>(local_360 + 1,piVar4);
    *local_50 = *piVar4;
    local_368 = 0;
    while (uVar14 = local_368,
          sVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size
                            (local_18), (int)uVar14 < (int)sVar3) {
      pvVar8 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
               operator[](local_18,(long)(int)local_368);
      if ((long)*local_50 <=
          pvVar8->pos + (long)*(int *)(local_20 + 8) + (long)*(int *)(local_20 + 4)) {
        pvVar8 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                 operator[](local_18,(long)(int)local_368);
        if ((long)(*local_50 + *local_38) <=
            (pvVar8->pos + (long)*(int *)(local_20 + 8)) - (long)*(int *)(local_20 + 4)) break;
        pvVar8 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                 operator[](local_18,(long)(int)local_368);
        local_36c = (float)(pvVar8->pos - (long)*local_50) / (float)*local_38;
        ImVec2::ImVec2(&local_374,local_36c * local_d4.x + local_108.x,local_108.y);
        ImVec2::ImVec2(&local_37c,local_36c * local_d4.x + local_108.x,local_108.y + local_d4.y);
        ImVec4::ImVec4(&local_38c,1.0,0.0,0.0,0.8);
        ImGui::ColorConvertFloat4ToU32((ImVec4 *)in_stack_fffffffffffff8c0);
        ImDrawList::AddLine((ImDrawList *)
                            CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                            (ImVec2 *)in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                            in_stack_fffffffffffff908);
        pvVar8 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                 operator[](local_18,(long)(int)local_368);
        local_390 = (float)(pvVar8->pos - (long)*local_50) / (float)*local_38;
        pvVar8 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                 operator[](local_18,(long)(int)local_368);
        local_394 = (float)(((pvVar8->pos + (long)*(int *)(local_20 + 8)) -
                            (long)*(int *)(local_20 + 4)) - (long)*local_50) / (float)*local_38;
        pvVar8 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                 operator[](local_18,(long)(int)local_368);
        local_398 = (float)((pvVar8->pos + (long)*(int *)(local_20 + 8) +
                            (long)*(int *)(local_20 + 4)) - (long)*local_50) / (float)*local_38;
        ImVec2::ImVec2(&local_3a0,local_390 * local_d4.x + local_108.x,local_108.y);
        ImVec2::ImVec2(&local_3a8,local_394 * local_d4.x + local_108.x,local_108.y);
        ImVec2::ImVec2(&local_3b0,local_398 * local_d4.x + local_108.x,local_108.y + local_d4.y);
        pfVar9 = std::min<float>(&local_3a0.x,&local_3a8.x);
        pfVar9 = std::min<float>(pfVar9,&local_3b0.x);
        fVar13 = *pfVar9;
        pfVar9 = std::max<float>(&local_3a0.x,&local_3a8.x);
        pfVar9 = std::max<float>(pfVar9,&local_3b0.x);
        bVar2 = false;
        if ((fVar13 < local_100.x) && (bVar2 = false, local_100.x < *pfVar9)) {
          bVar2 = false;
          if (local_3a8.y < local_100.y) {
            bVar2 = local_100.y < local_3b0.y;
          }
        }
        uVar14 = (uint)bVar2 << 0x18;
        fVar13 = 0.7;
        if (bVar2 == false) {
          fVar13 = 0.3;
        }
        ImVec4::ImVec4((ImVec4 *)&stack0xfffffffffffffc30,1.0,0.0,0.0,fVar13);
        ImGui::ColorConvertFloat4ToU32((ImVec4 *)in_stack_fffffffffffff8c0);
        ImDrawList::AddRectFilled
                  (in_stack_fffffffffffff8e0,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                   (ImU32)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
                   SUB84(in_stack_fffffffffffff8c8,0),
                   (ImDrawCornerFlags)((ulong)in_stack_fffffffffffff8c0 >> 0x20));
        if (((uVar14 & 0x1000000) != 0) &&
           ((((bVar2 = ImGui::IsMouseReleased
                                 ((ImGuiMouseButton)((ulong)in_stack_fffffffffffff8c0 >> 0x20)),
              bVar2 && (pIVar5 = ImGui::GetIO(), (pIVar5->KeyCtrl & 1U) != 0)) ||
             (bVar2 = ImGui::IsMouseDoubleClicked
                                ((ImGuiMouseButton)((ulong)in_stack_fffffffffffff8c0 >> 0x20)),
             bVar2)) && ((local_c9 & 1) == 0)))) {
          local_3e8 = (stKeyPressData<short> *)
                      std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                      begin((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                             *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
          local_3e0 = (stKeyPressData<short> *)
                      __gnu_cxx::
                      __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                      ::operator+((__normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                                   *)in_stack_fffffffffffff8c8,
                                  (difference_type)in_stack_fffffffffffff8c0);
          __gnu_cxx::
          __normal_iterator<stKeyPressData<short>const*,std::vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>>>
          ::__normal_iterator<stKeyPressData<short>*>
                    ((__normal_iterator<const_stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                      *)in_stack_fffffffffffff8c0,
                     (__normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
          __position._M_current._4_4_ = in_stack_fffffffffffff8dc;
          __position._M_current._0_4_ = in_stack_fffffffffffff8d8;
          local_3f0 = (stKeyPressData<short> *)
                      std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                      erase((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                             *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                            __position);
          local_368 = local_368 - 1;
        }
        if ((float)*local_38 < local_d4.x * 64.0) {
          in_stack_fffffffffffff928 = local_394 + local_398;
          in_stack_fffffffffffff924 = local_108.x;
          in_stack_fffffffffffff92c = local_d4.x;
          std::__cxx11::to_string(in_stack_fffffffffffff90c);
          std::__cxx11::string::c_str();
          local_400 = ImGui::CalcTextSize(in_stack_fffffffffffff8e8,
                                          (char *)in_stack_fffffffffffff8e0,
                                          SUB41((uint)in_stack_fffffffffffff8dc >> 0x18,0),
                                          in_stack_fffffffffffff8d8);
          in_stack_fffffffffffff918 =
               (in_stack_fffffffffffff928 * in_stack_fffffffffffff92c - local_400.x) * 0.5 +
               in_stack_fffffffffffff924;
          in_stack_fffffffffffff91c = local_108.y + local_d4.y;
          in_stack_fffffffffffff920 = ImGui::GetTextLineHeightWithSpacing();
          ImVec2::ImVec2(&local_3f8,in_stack_fffffffffffff918,
                         in_stack_fffffffffffff91c - in_stack_fffffffffffff920);
          ImGui::SetCursorScreenPos((ImVec2 *)in_stack_fffffffffffff8c0);
          std::__cxx11::string::~string(local_420);
          ImGui::Text("%d",(ulong)local_368);
        }
        local_430 = (float)((g_playbackData.offset + g_playbackData.idx) - (long)*local_50) /
                    (float)*local_38;
        ImVec2::ImVec2(&local_438,local_430 * local_d4.x + local_108.x,local_108.y);
        ImVec2::ImVec2(&local_440,local_430 * local_d4.x + local_108.x,local_108.y + local_d4.y);
        in_stack_fffffffffffff910 = local_110;
        ImVec4::ImVec4(&local_450,1.0,1.0,0.0,0.3);
        ImGui::ColorConvertFloat4ToU32((ImVec4 *)in_stack_fffffffffffff8c0);
        ImDrawList::AddLine((ImDrawList *)
                            CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                            (ImVec2 *)in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                            in_stack_fffffffffffff908);
      }
      local_368 = local_368 + 1;
    }
    local_454 = 0;
    while (col_00 = local_454,
          sVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size
                            (local_18), (int)col_00 < (int)sVar3) {
      pvVar8 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
               operator[](local_18,(long)(int)local_454);
      local_458 = (float)pvVar8->pos / (float)*local_48;
      ImVec2::ImVec2(&local_460,local_458 * local_d4.x + local_108.x,local_108.y + local_d4.y);
      ImVec2::ImVec2(&local_468,local_458 * local_d4.x + local_108.x,
                     local_108.y + local_d4.y + *local_80);
      ImVec4::ImVec4(&local_478,1.0,0.0,0.0,0.3);
      ImGui::ColorConvertFloat4ToU32((ImVec4 *)in_stack_fffffffffffff8c0);
      ImDrawList::AddLine((ImDrawList *)
                          CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                          (ImVec2 *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                          (ImVec2 *)in_stack_fffffffffffff910,col_00,in_stack_fffffffffffff908);
      local_454 = local_454 + 1;
    }
    ImGui::SetCursorScreenPos((ImVec2 *)in_stack_fffffffffffff8c0);
    ImGui::PushItemWidth(in_stack_fffffffffffff8d4);
    if ((*(byte *)(local_8 + 8) & 1) == 0) {
      if ((*(byte *)(local_8 + 9) & 1) != 0) {
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffb80,0.0,0.0);
        bVar2 = ImGui::Button((char *)in_stack_fffffffffffff8c0,
                              (ImVec2 *)
                              CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
        if ((bVar2) &&
           (sVar3 = std::vector<short,_std::allocator<short>_>::size
                              ((vector<short,_std::allocator<short>_> *)(local_8 + 400)),
           (float)(sVar3 / 16000) < 180.0)) {
          AudioLogger::resume((AudioLogger *)in_stack_fffffffffffff8c0);
          *(undefined1 *)(local_8 + 8) = 1;
          std::atomic<bool>::operator=
                    ((atomic<bool> *)in_stack_fffffffffffff8c0,
                     SUB41((uint)in_stack_fffffffffffff8bc >> 0x18,0));
        }
        IVar16 = ImGui::GetCursorScreenPos();
        in_stack_fffffffffffffb78 = IVar16;
        in_stack_fffffffffffffb68 =
             ImGui::CalcTextSize(in_stack_fffffffffffff8e8,(char *)in_stack_fffffffffffff8e0,
                                 SUB41((uint)in_stack_fffffffffffff8dc >> 0x18,0),
                                 in_stack_fffffffffffff8d8);
        fVar13 = in_stack_fffffffffffffb68.x * 0.9 + IVar16.x;
        fVar12 = IVar16.y;
        fVar11 = ImGui::GetFrameHeightWithSpacing();
        in_stack_fffffffffffffb70 = (TWaveformT<short> *)CONCAT44(fVar11 * -0.56 + fVar12,fVar13);
        ImGui::GetWindowDrawList();
        ImVec4::ImVec4((ImVec4 *)&stack0xfffffffffffffb58,1.0,0.0,0.0,1.0);
        ImGui::ColorConvertFloat4ToU32((ImVec4 *)in_stack_fffffffffffff8c0);
        ImDrawList::AddCircleFilled
                  (in_stack_fffffffffffff8e0,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                   in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0,
                   (int)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
        ImGui::SetCursorScreenPos((ImVec2 *)in_stack_fffffffffffff8c0);
        ImGui::SameLine((float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                        SUB84(in_stack_fffffffffffff8c0,0));
      }
      ImGui::Checkbox((char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                      (bool *)in_stack_fffffffffffff9e0);
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                      SUB84(in_stack_fffffffffffff8c0,0));
      if ((g_playbackData.playing & 1U) == 0) {
        ImVec2::ImVec2(&local_4b8,0.0,0.0);
        bVar2 = ImGui::Button((char *)in_stack_fffffffffffff8c0,
                              (ImVec2 *)
                              CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
        bVar15 = 1;
        if (!bVar2) {
          bVar2 = ImGui::IsKeyPressed(in_stack_fffffffffffff8d0,
                                      SUB81((ulong)in_stack_fffffffffffff8c8 >> 0x38,0));
          bVar15 = 0;
          if (bVar2) {
            pIVar5 = ImGui::GetIO();
            bVar15 = pIVar5->KeyCtrl;
          }
        }
        if ((bVar15 & 1) != 0) {
          g_playbackData.playing = true;
          g_playbackData.slowDown = 1;
          if ((renderKeyPresses::playHalfSpeed & 1U) != 0) {
            g_playbackData.slowDown = 2;
          }
          g_playbackData.idx = 0;
          g_playbackData.offset = (int64_t)*local_50;
          local_4cc = 160000;
          std::min<int>(&local_4cc,local_38);
          local_4c8 = getView<short>((TWaveformT<short> *)in_stack_fffffffffffff8c0,
                                     CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                                     0x18d97f);
          g_playbackData.waveform.samples = local_4c8.samples;
          g_playbackData.waveform.n = local_4c8.n;
          SDL_PauseAudioDevice(g_deviceIdOut,0);
        }
      }
      else {
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffb50,0.0,0.0);
        bVar2 = ImGui::Button((char *)in_stack_fffffffffffff8c0,
                              (ImVec2 *)
                              CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
        bVar15 = 1;
        if (!bVar2) {
          bVar2 = ImGui::IsKeyPressed(in_stack_fffffffffffff8d0,
                                      SUB81((ulong)in_stack_fffffffffffff8c8 >> 0x38,0));
          bVar15 = 0;
          if (bVar2) {
            pIVar5 = ImGui::GetIO();
            bVar15 = pIVar5->KeyCtrl;
          }
        }
        if ((bVar15 & 1) != 0) {
          g_playbackData.playing = false;
          g_playbackData.idx = g_playbackData.waveform.n + -0x400;
        }
      }
      if (g_playbackData.waveform.n + -0x200 <= g_playbackData.idx) {
        g_playbackData.playing = false;
        SDL_ClearQueuedAudio(g_deviceIdOut);
        SDL_PauseAudioDevice(g_deviceIdOut,1);
      }
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                      SUB84(in_stack_fffffffffffff8c0,0));
      bVar2 = ImGui::SliderFloat((char *)CONCAT44(in_stack_fffffffffffff8d4,
                                                  in_stack_fffffffffffff8d0),
                                 (float *)in_stack_fffffffffffff8c8,
                                 (float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                                 SUB84(in_stack_fffffffffffff8c0,0),
                                 (char *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),0.0);
      if (bVar2) {
        *local_30 = 1;
      }
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                      SUB84(in_stack_fffffffffffff8c0,0));
      bVar2 = ImGui::SliderInt((char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
                               ,(int *)in_stack_fffffffffffff8c8,
                               (int)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                               (int)in_stack_fffffffffffff8c0,
                               (char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8)
                              );
      if (bVar2) {
        *local_30 = 1;
      }
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                      SUB84(in_stack_fffffffffffff8c0,0));
      ImVec2::ImVec2(&local_4d4,0.0,0.0);
      bVar2 = ImGui::Button((char *)in_stack_fffffffffffff8c0,
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8))
      ;
      if (bVar2) {
        *local_30 = 1;
      }
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                      SUB84(in_stack_fffffffffffff8c0,0));
      ImGui::DragInt((char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (int *)in_stack_fffffffffffff8c8,
                     (float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                     (int)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc,(char *)0x18db16);
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                      SUB84(in_stack_fffffffffffff8c0,0));
      ImGui::DragInt((char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (int *)in_stack_fffffffffffff8c8,
                     (float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                     (int)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc,(char *)0x18db57);
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                      SUB84(in_stack_fffffffffffff8c0,0));
      ImGui::DragInt((char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (int *)in_stack_fffffffffffff8c8,
                     (float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                     (int)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc,(char *)0x18db95);
      ImGui::PopItemWidth();
    }
    else {
      bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff8c8);
      if (bVar2) {
        std::atomic<bool>::operator=
                  ((atomic<bool> *)in_stack_fffffffffffff8c0,
                   SUB41((uint)in_stack_fffffffffffff8bc >> 0x18,0));
        AudioLogger::record((AudioLogger *)
                            CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                            in_stack_fffffffffffff924,(int32_t)in_stack_fffffffffffff920);
      }
      ImVec2::ImVec2(&local_4dc,0.0,0.0);
      bVar2 = ImGui::Button((char *)in_stack_fffffffffffff8c0,
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8))
      ;
      if (bVar2) {
        AudioLogger::pause(&audioLogger);
        std::atomic<bool>::operator=
                  ((atomic<bool> *)in_stack_fffffffffffff8c0,
                   SUB41((uint)in_stack_fffffffffffff8bc >> 0x18,0));
        *(undefined1 *)(local_8 + 0xc) = 1;
        *(int *)(local_8 + 0x24) = *(int *)(local_8 + 0x24) + -1;
        *(undefined1 *)(local_8 + 8) = 0;
        *(undefined1 *)(local_8 + 0x9c) = 1;
        *(undefined1 *)(local_8 + 0x9d) = 1;
      }
      local_4f0 = ImGui::GetCursorScreenPos();
      uVar14 = 0xbf800000;
      local_4e4 = local_4f0;
      local_4f8 = ImGui::CalcTextSize(in_stack_fffffffffffff8e8,(char *)in_stack_fffffffffffff8e0,
                                      SUB41((uint)in_stack_fffffffffffff8dc >> 0x18,0),
                                      in_stack_fffffffffffff8d8);
      local_4f0.x = local_4f8.x * 0.9 + local_4f0.x;
      fVar11 = ImGui::GetFrameHeightWithSpacing();
      fVar13 = local_4f0.x;
      fVar11 = fVar11 * -0.56 + local_4f0.y;
      local_4f0.y = fVar11 - 4.0;
      local_4f0.x = local_4f0.x - 4.0;
      stack0xfffffffffffffb00 = CONCAT44(fVar11 + 4.0,fVar13 + 4.0);
      pIVar10 = ImGui::GetWindowDrawList();
      in_stack_fffffffffffff8c0 = (stKeyPressData<short> *)local_510;
      ImVec4::ImVec4((ImVec4 *)in_stack_fffffffffffff8c0,1.0,1.0,1.0,1.0);
      ImGui::ColorConvertFloat4ToU32((ImVec4 *)in_stack_fffffffffffff8c0);
      ImDrawList::AddRectFilled
                (in_stack_fffffffffffff8e0,
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                 (ImVec2 *)((ulong)uVar14 << 0x20),(ImU32)((ulong)pIVar10 >> 0x20),SUB84(pIVar10,0),
                 (ImDrawCornerFlags)((ulong)in_stack_fffffffffffff8c0 >> 0x20));
      ImGui::SetCursorScreenPos((ImVec2 *)in_stack_fffffffffffff8c0);
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                      SUB84(in_stack_fffffffffffff8c0,0));
      sVar3 = std::vector<short,_std::allocator<short>_>::size
                        ((vector<short,_std::allocator<short>_> *)(local_8 + 400));
      ImGui::Text(SUB84((double)((float)sVar3 / 16000.0),0),0x4066800000000000,
                  "Record length: %4.2f s (max : %4.2f s)");
    }
    if ((*local_30 & 1) != 0) {
      getView<short>((TWaveformT<short> *)in_stack_fffffffffffff8c0,
                     CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
      findKeyPresses<short>
                ((TWaveformViewT<short> *)in_stack_fffffffffffffb80,
                 (TKeyPressCollectionT<short> *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
                 (TWaveformT<short> *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                 (int)in_stack_fffffffffffffb5c,(int)in_stack_fffffffffffffb58,
                 (bool)in_stack_fffffffffffffb57);
      *local_30 = 0;
    }
    fVar13 = ImGui::GetWindowHeight();
    *(float *)(local_8 + 0x8c) = fVar13;
  }
  else {
    fVar13 = ImGui::GetTextLineHeightWithSpacing();
    *(float *)(local_8 + 0x8c) = fVar13;
  }
  ImGui::End();
  return false;
}

Assistant:

bool renderKeyPresses(stStateUI & stateUI, const TWaveform & waveform, TKeyPressCollection & keyPresses) {
    auto & params = stateUI.params;

    bool & scrolling = stateUI.scrolling;
    bool & recalculateKeyPresses = stateUI.recalculateKeyPresses;

    int & nview = stateUI.nview;
    int & viewMin = stateUI.viewMin;
    int & viewMax = stateUI.viewMax;
    int & offset = stateUI.offset;
    int & lastSize = stateUI.lastSize;
    int & lastKeyPresses = stateUI.lastKeyPresses;

    float & amin = stateUI.amin;
    float & amax = stateUI.amax;

    float & dragOffset = stateUI.dragOffset;
    float & scrollSize = stateUI.scrollSize;

    auto & nviewPrev = stateUI.nviewPrev;

    TWaveform & waveformLowRes = stateUI.waveformLowRes;
    TWaveform & waveformThreshold = stateUI.waveformThreshold;
    TWaveform & waveformMax = stateUI.waveformMax;

    if (nview < 0) nview = waveform.size();
    if (offset < 0) offset = (waveform.size() - nview)/2;

    if (stateUI.recording) {
        if (nview < 1024*kSamplesPerFrame && scrolling == false) {
            nview = std::min((int) (1024*kSamplesPerFrame), (int) waveform.size());
        }
    }

    if (lastSize != (int) waveform.size()) {
        viewMax = waveform.size();
        lastSize = waveform.size();
        nviewPrev = nview + 1;

        if (scrolling == false) {
            offset = waveform.size() - nview;
        }
    }

#if 0
    if ((int) keyPresses.size() >= lastKeyPresses + 10) {
        lastKeyPresses = keyPresses.size();

        stateUI.similarityMap.clear();
        stateUI.flags.recalculateSimilarityMap = true;
        stateUI.doUpdate = true;
    }
#endif

    ImGui::SetNextWindowPos(ImVec2(0, stateUI.windowHeightTitleBar), ImGuiCond_Once);
    if (stateUI.windowHeightKeyPesses == 0.0f) {
        ImGui::SetNextWindowSize(ImVec2(g_windowSizeX, 250.0f), ImGuiCond_Always);
    } else {
        ImGui::SetNextWindowSize(ImVec2(g_windowSizeX, stateUI.windowHeightKeyPesses), ImGuiCond_Always);
    }
    if (ImGui::Begin("Key Presses", nullptr, ImGuiWindowFlags_NoMove)) {
        bool ignoreDelete = false;

        auto wsize = ImVec2(ImGui::GetContentRegionAvailWidth(), ImGui::GetContentRegionAvail().y - 3*ImGui::GetTextLineHeightWithSpacing());

        if (nview != nviewPrev) {
            generateLowResWaveform(waveform, waveformLowRes, std::max(1.0f, nview/wsize.x));
            nviewPrev = nview;
        }

        auto wview = getView(waveformLowRes, offset, nview);

        auto mpos = ImGui::GetIO().MousePos;
        auto savePos = ImGui::GetCursorScreenPos();
        auto drawList = ImGui::GetWindowDrawList();
        ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.3f, 0.3f, 0.3f, 0.3f });
        ImGui::PushStyleColor(ImGuiCol_PlotHistogram, { 1.0f, 1.0f, 1.0f, 1.0f });
        ImGui::PlotHistogram("##Waveform", plotWaveform, &wview, nview, 0, "Waveform", amin, amax, wsize);
        ImGui::PopStyleColor(2);
        ImGui::SetCursorScreenPos(savePos);
        ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.1f, 0.1f, 0.1f, 0.0f });
        ImGui::PushStyleColor(ImGuiCol_PlotHistogram, { 1.0f, 1.0f, 1.0f, 1.0f });
        ImGui::PlotHistogram("##Waveform", plotWaveformInverse, &wview, nview, 0, "Waveform", amin, amax, wsize);
        ImGui::PopStyleColor(2);

        if (waveform.size() == waveformThreshold.size() && waveform.size() == waveformMax.size()) {
            auto tview = getView(waveformThreshold, offset, nview);
            auto mview = getView(waveformMax, offset, nview);

            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 1.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformThreshold", plotWaveform, &tview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 1.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformThreshold", plotWaveformInverse, &tview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 0.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformMax", plotWaveform, &mview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 0.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformMax", plotWaveformInverse, &mview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
        }
        ImGui::SetCursorScreenPos(savePos);

        ImGui::InvisibleButton("##WaveformIB",wsize);
        if (ImGui::IsItemHovered()) {
            auto w = ImGui::GetIO().MouseWheel;
            auto nview_old = nview;
            nview *= (10.0 + w)/10.0;
            nview = std::min(std::max(viewMin, nview), viewMax);
            if (w != 0.0) {
                offset = std::max(0.0f, offset + ((mpos.x - savePos.x)/wsize.x)*(nview_old - nview));
            }

            if (ImGui::IsMouseDown(0) && ImGui::IsMouseDragging(0) == false) {
                dragOffset = offset;
            }

            if (ImGui::IsMouseDragging(0)) {
                offset = dragOffset - ImGui::GetMouseDragDelta(0).x*nview/wsize.x;
            }

            if ((ImGui::IsMouseReleased(0) && ImGui::GetIO().KeyCtrl) || ImGui::IsMouseDoubleClicked(0)) {
                int i = 0;
                int64_t pos = offset + nview*(mpos.x - savePos.x)/wsize.x;
                for (i = 0; i < (int) keyPresses.size(); ++i) {
                    int64_t p0 = keyPresses[i].pos + params.offsetFromPeak_samples - params.keyPressWidth_samples;
                    int64_t p1 = keyPresses[i].pos + params.offsetFromPeak_samples + params.keyPressWidth_samples;
                    int64_t pmin = std::min(std::min(keyPresses[i].pos, p0), p1);
                    int64_t pmax = std::max(std::max(keyPresses[i].pos, p0), p1);
                    if (pmin > pos) {
                        ignoreDelete = true;
                        TKeyPressData entry;
                        entry.pos = pos;
                        entry.waveform = getView(waveform, 0);
                        keyPresses.insert(keyPresses.begin() + i, entry);
                        break;
                    }
                    if (pos >= pmin && pos <= pmax) break;
                }
                if (i == (int) keyPresses.size() && ignoreDelete == false) {
                    ignoreDelete = true;
                    TKeyPressData entry;
                    entry.pos = pos;
                    entry.waveform = getView(waveform, 0);
                    keyPresses.push_back(entry);
                }
            }
        }
        if (ImGui::BeginPopupContextWindow()) {
            ImGui::SliderInt("View  ", &nview, viewMin, viewMax);
            ImGui::DragInt  ("Offset", &offset, 0.01*nview, 0, waveform.size() - nview);
            ImGui::SliderFloat("Amplitude Min", &amin, -32000, 0);
            ImGui::SliderFloat("Amplitude Max", &amax, 0, 32000);
            ImGui::EndPopup();
        }

        ImGui::InvisibleButton("##WaveformScrollIB", {wsize.x, scrollSize});
        drawList->AddRect({savePos.x, savePos.y + wsize.y}, {savePos.x + wsize.x, savePos.y + wsize.y + scrollSize}, ImGui::ColorConvertFloat4ToU32({1.0f, 1.0f, 1.0f, 1.0f}));
        drawList->AddRectFilled({savePos.x + wsize.x*(1.f*offset)/viewMax, savePos.y + wsize.y}, {savePos.x + wsize.x*(1.f*offset + nview)/viewMax, savePos.y + wsize.y + scrollSize}, ImGui::ColorConvertFloat4ToU32({1.0f, 1.0f, 1.0f, 1.0f}));

        auto savePos2 = ImGui::GetCursorScreenPos();

        if (ImGui::IsItemHovered()) {
            if (ImGui::IsMouseDown(0)) {
                scrolling = true;
            }
        }

        if (scrolling) {
            offset = ((mpos.x - savePos.x)/wsize.x)*viewMax - nview/2;
        }

        if (ImGui::IsMouseDown(0) == false) {
            scrolling = false;
        }

        offset = std::max(0, std::min((int) offset, (int) waveform.size() - nview));
        for (int i = 0; i < (int) keyPresses.size(); ++i) {
            if (keyPresses[i].pos + params.offsetFromPeak_samples + params.keyPressWidth_samples < offset) continue;
            if (keyPresses[i].pos + params.offsetFromPeak_samples - params.keyPressWidth_samples >= offset + nview) break;

            {
                float x0 = ((float)(keyPresses[i].pos - offset))/nview;

                ImVec2 p0 = { savePos.x + x0*wsize.x, savePos.y };
                ImVec2 p1 = { savePos.x + x0*wsize.x, savePos.y + wsize.y };

                drawList->AddLine(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, 0.8f }), 1.0f);
            }

            {
                float x0 = ((float)(keyPresses[i].pos - offset))/nview;
                float x1 = ((float)(keyPresses[i].pos + params.offsetFromPeak_samples - params.keyPressWidth_samples - offset))/nview;
                float x2 = ((float)(keyPresses[i].pos + params.offsetFromPeak_samples + params.keyPressWidth_samples - offset))/nview;

                ImVec2 p0 = { savePos.x + x0*wsize.x, savePos.y };
                ImVec2 p1 = { savePos.x + x1*wsize.x, savePos.y };
                ImVec2 p2 = { savePos.x + x2*wsize.x, savePos.y + wsize.y };

                float xmin = std::min(std::min(p0.x, p1.x), p2.x);
                float xmax = std::max(std::max(p0.x, p1.x), p2.x);

                bool isHovered = (mpos.x > xmin && mpos.x < xmax && mpos.y > p1.y && mpos.y < p2.y);

                float col = isHovered ? 0.7f : 0.3f;
                drawList->AddRectFilled(p1, p2, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, col }));

                if (isHovered) {
                    if (((ImGui::IsMouseReleased(0) && ImGui::GetIO().KeyCtrl) || ImGui::IsMouseDoubleClicked(0)) && ignoreDelete == false) {
                        keyPresses.erase(keyPresses.begin() + i);
                        --i;
                    }
                }

                if (nview < 64.0*wsize.x) {
                    ImGui::SetCursorScreenPos({ savePos.x + 0.5f*((x1 + x2)*wsize.x - ImGui::CalcTextSize(std::to_string(i).c_str()).x), savePos.y + wsize.y - ImGui::GetTextLineHeightWithSpacing() });
                    ImGui::Text("%d", i);
                }

            }

            {
                float x0 = ((float)(g_playbackData.offset + g_playbackData.idx - offset))/nview;

                ImVec2 p0 = {savePos.x + x0*wsize.x, savePos.y};
                ImVec2 p1 = {savePos.x + x0*wsize.x, savePos.y + wsize.y};
                drawList->AddLine(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 1.0f, 0.0f, 0.3f }));
            }
        }
        for (int i = 0; i < (int) keyPresses.size(); ++i) {
            {
                float x0 = ((float)(keyPresses[i].pos))/viewMax;

                ImVec2 p0 = { savePos.x + x0*wsize.x, savePos.y + wsize.y };
                ImVec2 p1 = { savePos.x + x0*wsize.x, savePos.y + wsize.y + scrollSize };

                drawList->AddLine(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, 0.3f }));
            }
        }

        ImGui::SetCursorScreenPos(savePos2);

        //auto io = ImGui::GetIO();
        //ImGui::Text("Keys pressed:");   for (int i = 0; i < IM_ARRAYSIZE(io.KeysDown); i++) if (ImGui::IsKeyPressed(i))             { ImGui::SameLine(); ImGui::Text("%d", i); }

        static bool playHalfSpeed = false;
        static int historySizeReset = kFindKeysHistorySizeReset;
        static float thresholdBackground = kFindKeysThreshold;
        ImGui::PushItemWidth(100.0);

        if (stateUI.recording == false) {
            if (stateUI.audioCapture) {
                if (ImGui::Button("   Record")) {
                    if (float(stateUI.waveformInput.size()/kSampleRate) < kMaxRecordSize_s) {
                        audioLogger.resume();
                        stateUI.recording = true;
                        g_doRecord = true;
                    }
                }
                {
                    auto savePos = ImGui::GetCursorScreenPos();
                    auto p = savePos;
                    p.x += 0.90f*ImGui::CalcTextSize("  ").x;
                    p.y -= 0.56f*ImGui::GetFrameHeightWithSpacing();
                    ImGui::GetWindowDrawList()->AddCircleFilled(p, 6.0, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, 1.0f }));
                    ImGui::SetCursorScreenPos(savePos);
                }

                ImGui::SameLine();
            }

            ImGui::Checkbox("x0.5", &playHalfSpeed);
            ImGui::SameLine();
            if (g_playbackData.playing) {
                if (ImGui::Button("Stop") || (ImGui::IsKeyPressed(44) && ImGui::GetIO().KeyCtrl)) { // Ctrl + space
                    g_playbackData.playing = false;
                    g_playbackData.idx = g_playbackData.waveform.n - TPlaybackData::kSamples;
                }
            } else {
                if (ImGui::Button("Play") || (ImGui::IsKeyPressed(44) && ImGui::GetIO().KeyCtrl)) { // Ctrl + space
                    g_playbackData.playing = true;
                    g_playbackData.slowDown = playHalfSpeed ? 2 : 1;
                    g_playbackData.idx = 0;
                    g_playbackData.offset = offset;
                    g_playbackData.waveform = getView(waveform, offset, std::min((int) (10*kSampleRate), nview));
                    SDL_PauseAudioDevice(g_deviceIdOut, 0);
                }
            }

            if (g_playbackData.idx >= g_playbackData.waveform.n - kSamplesPerFrame) {
                g_playbackData.playing = false;
                SDL_ClearQueuedAudio(g_deviceIdOut);
#ifndef __EMSCRIPTEN__
                SDL_PauseAudioDevice(g_deviceIdOut, 1);
#endif
            }

            ImGui::SameLine();
            ImGui::SliderFloat("Threshold background", &thresholdBackground, 0.1f, 50.0f) && (recalculateKeyPresses = true);
            ImGui::SameLine();
            ImGui::SliderInt("History Size", &historySizeReset, 512, 1024*16) && (recalculateKeyPresses = true);
            ImGui::SameLine();
            if (ImGui::Button("Recalculate")) {
                recalculateKeyPresses = true;
            }

            ImGui::SameLine();
            ImGui::DragInt("Key width", &params.keyPressWidth_samples, 8, 0, kSampleRate/10);
            ImGui::SameLine();
            ImGui::DragInt("Peak offset", &params.offsetFromPeak_samples, 8, -kSampleRate/10, kSampleRate/10);
            ImGui::SameLine();
            ImGui::DragInt("Align window", &params.alignWindow_samples, 8, 0, kSampleRate/10);

            ImGui::PopItemWidth();
        } else {
            if (g_doRecord) {
                g_doRecord = false;
                audioLogger.record(0.2f, 0);
            }

            if (ImGui::Button("   Stop Recording")) {
                audioLogger.pause();
                g_doRecord = false;

                stateUI.recalculateKeyPresses = true;
                stateUI.lastSize = stateUI.lastSize - 1;
                stateUI.recording = false;
                stateUI.findBestCutoffFreq = true;
                stateUI.rescaleWaveform = true;
            }
            {
                auto savePos = ImGui::GetCursorScreenPos();
                auto p0 = savePos;
                p0.x += 0.90f*ImGui::CalcTextSize("  ").x;
                p0.y -= 0.56f*ImGui::GetFrameHeightWithSpacing();

                auto p1 = p0;
                p0.x -= 4.0f;
                p0.y -= 4.0f;
                p1.x += 4.0f;
                p1.y += 4.0f;

                ImGui::GetWindowDrawList()->AddRectFilled(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 1.0f, 1.0f, 1.0f }));
                ImGui::SetCursorScreenPos(savePos);
            }

            ImGui::SameLine();
            ImGui::Text("Record length: %4.2f s (max : %4.2f s)", (float)(stateUI.waveformInput.size())/kSampleRate, kMaxRecordSize_s);
        }

        if (recalculateKeyPresses) {
            findKeyPresses(getView(waveform, 0), keyPresses, waveformThreshold, waveformMax, thresholdBackground, kFindKeysHistorySize, historySizeReset, kFindKeysRemoveLowPower);
            recalculateKeyPresses = false;
        }

        stateUI.windowHeightKeyPesses = ImGui::GetWindowHeight();
    } else {
        stateUI.windowHeightKeyPesses = ImGui::GetTextLineHeightWithSpacing();
    }
    ImGui::End();

    return false;
}